

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surf.cc
# Opt level: O0

bool __thiscall features::Surf::descriptor_orientation(Surf *this,Descriptor *descr)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ImageBase *pIVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double length;
  double sample_deg_m;
  double sample_deg_p;
  double sample_deg;
  double dStack_5c8;
  int i;
  double sum_dy;
  double sum_dx;
  double win_end;
  double win_start;
  double deg;
  double best_length;
  double best_dy;
  double best_dx;
  double window_halfsize;
  double window_increment;
  int local_570;
  int rx;
  int index;
  int ry;
  float dy [109];
  float dx [109];
  float local_1e8;
  int spacing;
  float gaussian [109];
  int height;
  int width;
  int descr_scale;
  int descr_y;
  int descr_x;
  Descriptor *descr_local;
  Surf *this_local;
  
  iVar1 = (int)(descr->x + 0.5);
  iVar2 = (int)(descr->y + 0.5);
  iVar3 = (int)descr->scale;
  pIVar5 = (ImageBase *)
           std::__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->sat);
  gaussian[0x6c] = (float)core::ImageBase::width(pIVar5);
  pIVar5 = (ImageBase *)
           std::__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->sat);
  gaussian[0x6b] = (float)core::ImageBase::height(pIVar5);
  memcpy(&local_1e8,&DAT_0014c3b0,0x1b4);
  iVar4 = iVar3 * 8 + 1;
  if ((((iVar1 < iVar4) || (iVar2 < iVar4)) || ((int)gaussian[0x6c] <= iVar1 + iVar4)) ||
     ((int)gaussian[0x6b] <= iVar2 + iVar4)) {
    this_local._7_1_ = false;
  }
  else {
    local_570 = 0;
    for (rx = -5; rx < 6; rx = rx + 1) {
      for (window_increment._4_4_ = -5; window_increment._4_4_ < 6;
          window_increment._4_4_ = window_increment._4_4_ + 1) {
        if (window_increment._4_4_ * window_increment._4_4_ + rx * rx < 0x24) {
          filter_dx_dy(this,iVar1 + window_increment._4_4_ * iVar3,iVar2 + rx * iVar3,iVar3 << 1,
                       dx + (long)local_570 + -2,(float *)(&index + local_570));
          dx[(long)local_570 + -2] = (&local_1e8)[local_570] * dx[(long)local_570 + -2];
          (&index)[local_570] = (int)((&local_1e8)[local_570] * (float)(&index)[local_570]);
          local_570 = local_570 + 1;
        }
      }
    }
    best_dy = 0.0;
    best_length = 0.0;
    deg = 0.0;
    for (win_start = -3.141592653589793; win_start < 3.141592653589793;
        win_start = win_start + 0.39269908169872414) {
      dVar6 = win_start - 0.5235987755982988;
      dVar7 = win_start + 0.5235987755982988;
      sum_dy = 0.0;
      dStack_5c8 = 0.0;
      for (sample_deg._4_4_ = 0; sample_deg._4_4_ < 0x6d; sample_deg._4_4_ = sample_deg._4_4_ + 1) {
        dVar8 = std::atan2((double)(ulong)(uint)(&index)[sample_deg._4_4_],
                           (double)(ulong)(uint)dx[(long)sample_deg._4_4_ + -2]);
        dVar8 = (double)SUB84(dVar8,0);
        if ((((dVar6 < dVar8) && (dVar8 < dVar7)) ||
            ((dVar6 < dVar8 + 6.283185307179586 && (dVar8 + 6.283185307179586 < dVar7)))) ||
           ((dVar6 < dVar8 - 6.283185307179586 && (dVar8 - 6.283185307179586 < dVar7)))) {
          sum_dy = (double)dx[(long)sample_deg._4_4_ + -2] + sum_dy;
          dStack_5c8 = (double)(float)(&index)[sample_deg._4_4_] + dStack_5c8;
        }
      }
      dVar6 = sum_dy * sum_dy + dStack_5c8 * dStack_5c8;
      if (deg < dVar6) {
        best_dy = sum_dy;
        best_length = dStack_5c8;
        deg = dVar6;
      }
    }
    dVar6 = atan2(best_length,best_dy);
    descr->orientation = (float)dVar6;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool
Surf::descriptor_orientation (Descriptor* descr)
{
    int const descr_x = static_cast<int>(descr->x + 0.5f);
    int const descr_y = static_cast<int>(descr->y + 0.5f);
    int const descr_scale = static_cast<int>(descr->scale);
    int const width = this->sat->width();
    int const height = this->sat->height();

    /*
     * Pre-computed gaussian weights for the (circular) window. The gaussian
     * is computed as exp((dx^2 + dy^2) / (2 * sigma^2) with sigma = 2.5.
     */
    float const gaussian[109] = { 0.0658748, 0.0982736, 0.12493, 0.135335,
        0.12493, 0.0982736, 0.0658748, 0.0773047, 0.135335, 0.201897, 0.256661,
        0.278037, 0.256661, 0.201897, 0.135335, 0.0773047, 0.0658748, 0.135335,
        0.236928, 0.353455, 0.449329, 0.486752, 0.449329, 0.353455, 0.236928,
        0.135335, 0.0658748, 0.0982736, 0.201897, 0.353455, 0.527292, 0.67032,
        0.726149, 0.67032, 0.527292, 0.353455, 0.201897, 0.0982736, 0.12493,
        0.256661, 0.449329, 0.67032, 0.852144, 0.923116, 0.852144, 0.67032,
        0.449329, 0.256661, 0.12493, 0.135335, 0.278037, 0.486752, 0.726149,
        0.923116, 1, 0.923116, 0.726149, 0.486752, 0.278037, 0.135335, 0.12493,
        0.256661, 0.449329, 0.67032, 0.852144, 0.923116, 0.852144, 0.67032,
        0.449329, 0.256661, 0.12493, 0.0982736, 0.201897, 0.353455, 0.527292,
        0.67032, 0.726149, 0.67032, 0.527292, 0.353455, 0.201897, 0.0982736,
        0.0658748, 0.135335, 0.236928, 0.353455, 0.449329, 0.486752, 0.449329,
        0.353455, 0.236928, 0.135335, 0.0658748, 0.0773047, 0.135335, 0.201897,
        0.256661, 0.278037, 0.256661, 0.201897, 0.135335, 0.0773047, 0.0658748,
        0.0982736, 0.12493, 0.135335, 0.12493, 0.0982736, 0.0658748 };

    /*
     * At least a 12 * scale pixel kernel for the support circle is needed.
     * Additionally, computing the Haar Wavelet response uses a kernel size
     * of 4 * scale pixel. That makes a total of (6 + 2) * scale pixel on
     * either side of the kernel spacing. One additional pixel is needed
     * to the upper-left side to simplify integral image access.
     */
    int const spacing = 8 * descr_scale + 1;
    if (descr_x < spacing || descr_y < spacing
        || descr_x + spacing >= width || descr_y + spacing >= height)
        return false;

    /* The number of samples is constant, depending on radius. */
#define NUM_SAMPLES 109
    float dx[NUM_SAMPLES], dy[NUM_SAMPLES];

    /*
     * Iterate over the pixels of a circle with radius 6 * scale
     * and compute Haar Wavelet responses in x- and y-direction.
     */
    for (int ry = -5, index = 0; ry <= 5; ++ry)
        for (int rx = -5; rx <= 5; ++rx)
        {
            if (rx * rx + ry * ry >= 36)
                continue;
            this->filter_dx_dy(descr_x + rx * descr_scale,
                descr_y + ry * descr_scale, 2 * descr_scale,
                dx + index, dy + index);
            dx[index] *= gaussian[index];
            dy[index] *= gaussian[index];
            index += 1;
        }

    /*
     * Iterate in a sliding window over the 109 extracted samples
     * in order to find a dominant orientation for the keypoint.
     */
    double const window_increment = MATH_PI / 8.0;
    double const window_halfsize = MATH_PI / 6.0;
    double best_dx = 0.0, best_dy = 0.0;
    double best_length = 0.0f;
    for (double deg = -MATH_PI; deg < MATH_PI; deg += window_increment)
    {
        /* Evaluate samples for this window. */
        double const win_start = deg - window_halfsize;
        double const win_end = deg + window_halfsize;
        double sum_dx = 0.0f, sum_dy = 0.0f;
        for (int i = 0; i < NUM_SAMPLES; ++i)
        {
            double const sample_deg = std::atan2(dy[i], dx[i]);
            double const sample_deg_p = sample_deg + 2.0 * MATH_PI;
            double const sample_deg_m = sample_deg - 2.0 * MATH_PI;
            if ((sample_deg > win_start && sample_deg < win_end)
                || (sample_deg_p > win_start && sample_deg_p < win_end)
                || (sample_deg_m > win_start && sample_deg_m < win_end))
            {
                sum_dx += dx[i];
                sum_dy += dy[i];
            }
        }

        /* Total vector length of dx/dy sums defines dominance. */
        double const length = sum_dx * sum_dx + sum_dy * sum_dy;
        if (length > best_length)
        {
            best_dx = sum_dx;
            best_dy = sum_dy;
            best_length = length;
        }
    }

    /* TODO: Threshold on the vector length? */
    descr->orientation = std::atan2(best_dy, best_dx);
    return true;
}